

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O3

void shunt_map_up_right(tgestate_t *state)

{
  uint8_t *puVar1;
  
  (state->map_position).x = (state->map_position).x + 0xff;
  puVar1 = &(state->map_position).y;
  *puVar1 = *puVar1 + '\x01';
  get_supertiles(state);
  memmove(state->tile_buf + 1,state->tile_buf + 0x18,0x180);
  memmove(state->window_buf + 1,state->window_buf + 0xc0,0xc00);
  plot_horizontal_tiles_common
            (state,state->tile_buf + 0x180,state->map_buf + 0x1c,(state->map_position).y,
             state->window_buf + 0xc00);
  plot_vertical_tiles_common
            (state,state->tile_buf,state->map_buf,(state->map_position).x,state->window_buf);
  return;
}

Assistant:

void shunt_map_up_right(tgestate_t *state)
{
  assert(state != NULL);

  /* Conv: The original code has a copy of map_position in HL on entry. In
   * this version we read it from source. */
  state->map_position.x--;
  state->map_position.y++;

  get_supertiles(state);

  memmove(&state->tile_buf[1], &state->tile_buf[24], TILE_BUF_LENGTH - 24);
  memmove(&state->window_buf[1], &state->window_buf[24 * 8], WINDOW_BUF_LENGTH - 24 * 8);

  plot_bottommost_tiles(state);
  plot_leftmost_tiles(state);
}